

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  long lVar1;
  byte *pbVar2;
  span<char> *this_00;
  bt_peer_connection *pbVar3;
  piece_index_t index;
  piece_picker *this_01;
  bool bVar4;
  int val;
  int iVar5;
  int v;
  element_type *peVar6;
  long l;
  char *last;
  char *pcVar7;
  unsigned_long __n;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *this_02;
  reference psVar8;
  undefined8 uVar9;
  counters *this_03;
  counters **p_00;
  counters **ppcVar10;
  undefined8 uStack_250;
  counters *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  unsigned_long local_228;
  undefined1 local_219;
  byte *local_218;
  uint local_20c;
  int local_208;
  int local_204;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *local_200;
  undefined1 local_1f2;
  undefined1 local_1f1;
  piece_picker *local_1f0;
  byte *local_1e8;
  unsigned_long local_1e0;
  char local_1d2;
  undefined1 local_1d1;
  span<char> *local_1d0;
  char *local_1c8;
  char *local_1c0;
  unsigned_long local_1b8;
  long local_1b0;
  int local_1a4;
  torrent_info *local_1a0;
  int local_198;
  int local_194;
  undefined1 local_18e;
  undefined1 local_18d;
  int local_18c;
  torrent *local_188;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_180;
  undefined1 local_175;
  int local_174;
  torrent *local_170;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_168;
  undefined1 local_159;
  bt_peer_connection *local_158;
  span<const_char> local_150;
  ulong local_140;
  size_t k;
  unsigned_long n_pieces;
  string bitfield_string;
  const_iterator cStack_108;
  piece_index_t p_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *__range2;
  piece_index_t local_e8;
  int local_e4;
  piece_index_t i;
  int mask;
  piece_picker *p;
  byte *local_d0;
  char *ptr;
  alloca_destructor<char> msg_destructor;
  char *pcStack_b0;
  char *TORRENT_ALLOCA_tmp;
  char *local_98;
  long local_90;
  long TORRENT_ALLOCA_size;
  span<char> msg;
  int packet_size;
  uint8_t char_top_bit;
  uint8_t char_bit_mask;
  int num_pieces;
  piece_index_t local_58;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_54;
  int local_50;
  int local_4c;
  piece_index_t local_48;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_44;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_40 [2];
  piece_index_t piece;
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bt_peer_connection *this_local;
  
  p_00 = &local_248;
  ppcVar10 = &local_248;
  uStack_250 = 0x2311d0;
  local_158 = this;
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peer_connection::associated_torrent((peer_connection *)local_30);
  uStack_250 = 0x2311dd;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_20);
  uStack_250 = 0x2311e6;
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_30);
  uStack_250 = 0x2311ff;
  peVar6 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  uStack_250 = 0x231207;
  local_159 = torrent::super_seeding(peVar6);
  if ((bool)local_159) {
    uStack_250 = 0x23123f;
    peer_connection::peer_log
              (&local_158->super_peer_connection,info,"BITFIELD",
               "not sending bitfield, super seeding");
    if (((byte)(local_158->super_peer_connection).field_0x889 >> 2 & 1) != 0) {
      uStack_250 = 0x231261;
      write_have_none(local_158);
    }
    (local_158->super_peer_connection).field_0x889 =
         (local_158->super_peer_connection).field_0x889 | 8;
    uStack_250 = 0x231295;
    local_170 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_20);
    uStack_250 = 0x2312a8;
    local_168 = peer_connection::get_bitfield(&local_158->super_peer_connection);
    uStack_250 = 0x2312c4;
    local_174 = (int)torrent::get_piece_to_super_seed(local_170,local_168);
    uStack_250 = 0x2312e0;
    local_40[0].m_val = local_174;
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_44,0);
    uStack_250 = 0x2312ef;
    local_175 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          (local_40,&local_44);
    if ((bool)local_175) {
      uStack_250 = 0x231311;
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_48,-1);
      local_4c = local_40[0].m_val;
      uStack_250 = 0x23132b;
      peer_connection::superseed_piece
                (&local_158->super_peer_connection,local_48,(piece_index_t)local_40[0].m_val);
    }
    uStack_250 = 0x231338;
    local_188 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_20);
    uStack_250 = 0x23134b;
    local_180 = peer_connection::get_bitfield(&local_158->super_peer_connection);
    uStack_250 = 0x231367;
    local_18c = (int)torrent::get_piece_to_super_seed(local_188,local_180);
    uStack_250 = 0x231389;
    local_50 = local_18c;
    local_40[0].m_val = local_18c;
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_54,0);
    uStack_250 = 0x231398;
    local_18d = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                          (local_40,&local_54);
    if ((bool)local_18d) {
      uStack_250 = 0x2313ba;
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_58,-1);
      uStack_250 = 0x2313d4;
      peer_connection::superseed_piece
                (&local_158->super_peer_connection,local_58,(piece_index_t)local_40[0].m_val);
      ppcVar10 = &local_248;
    }
  }
  else {
    if (((byte)(local_158->super_peer_connection).field_0x889 >> 2 & 1) != 0) {
      uStack_250 = 0x231403;
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      uStack_250 = 0x23140b;
      local_18e = torrent::is_seed(peVar6);
      if ((bool)local_18e) {
        uStack_250 = 0x23142b;
        write_have_all(local_158);
        ppcVar10 = &local_248;
        goto LAB_00231bc7;
      }
    }
    if (((byte)(local_158->super_peer_connection).field_0x889 >> 2 & 1) != 0) {
      uStack_250 = 0x231458;
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      uStack_250 = 0x231460;
      local_194 = torrent::num_have(peVar6);
      if (local_194 == 0) {
        uStack_250 = 0x23147f;
        write_have_none(local_158);
        ppcVar10 = &local_248;
        goto LAB_00231bc7;
      }
    }
    uStack_250 = 0x231496;
    peVar6 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
    uStack_250 = 0x23149e;
    local_198 = torrent::num_have(peVar6);
    if (local_198 == 0) {
      uStack_250 = 0x2314d2;
      peer_connection::peer_log
                (&local_158->super_peer_connection,info,"BITFIELD","not sending bitfield, have none"
                );
      (local_158->super_peer_connection).field_0x889 =
           (local_158->super_peer_connection).field_0x889 & 0xf7 | 8;
      ppcVar10 = &local_248;
    }
    else {
      uStack_250 = 0x231506;
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
      uStack_250 = 0x23150e;
      local_1a0 = torrent::torrent_file(peVar6);
      uStack_250 = 0x231523;
      val = torrent_info::num_pieces(local_1a0);
      iVar5 = val + 7;
      if (val + 7 < 0) {
        iVar5 = val + 0xe;
      }
      iVar5 = iVar5 >> 3;
      v = iVar5 + 5;
      uStack_250 = 0x231562;
      local_1a4 = val;
      span<char>::span((span<char> *)&TORRENT_ALLOCA_size);
      uStack_250 = 0x23156a;
      l = numeric_cast<long,int,void>(v);
      local_1b0 = l;
      local_90 = l;
      if (l < 0x1001) {
        if (0 < v) {
          lVar1 = -((long)v + 0xfU & 0xfffffffffffffff0);
          p_00 = (counters **)((long)&local_248 + lVar1);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x231622;
          span<char>::span((span<char> *)&msg_destructor.objects.m_len,(char *)p_00,l);
          TORRENT_ALLOCA_size = msg_destructor.objects.m_len;
          msg.m_ptr = pcStack_b0;
          local_1d0 = (span<char> *)&TORRENT_ALLOCA_size;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x23163d;
          local_1c8 = span<char>::begin((span<char> *)&TORRENT_ALLOCA_size);
          this_00 = local_1d0;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x231650;
          last = span<char>::end(this_00);
          pcVar7 = local_1c8;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x23165f;
          uninitialized_default_construct<char*>(pcVar7,last);
        }
      }
      else {
        uStack_250 = 0x231596;
        local_1b8 = numeric_cast<unsigned_long,int,void>(v);
        uStack_250 = 0x2315ab;
        local_1c0 = (char *)operator_new__(local_1b8);
        uStack_250 = 0x2315ce;
        span<char>::span((span<char> *)&TORRENT_ALLOCA_tmp,local_1c0,local_90);
        TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
        msg.m_ptr = local_98;
        p_00 = &local_248;
      }
      builtin_strncpy((char *)((long)p_00 + -8),"u\x16#",4);
      *(char *)((long)p_00 + -4) = '\0';
      *(char *)((long)p_00 + -3) = '\0';
      *(char *)((long)p_00 + -2) = '\0';
      *(char *)((long)p_00 + -1) = '\0';
      span<char>::span<libtorrent::span<char>,char,void>
                ((span<char> *)&ptr,(span<char> *)&TORRENT_ALLOCA_size);
      *(char *)((long)p_00 + -8) = -0x80;
      *(char *)((long)p_00 + -7) = '\x16';
      *(char *)((long)p_00 + -6) = '#';
      *(char *)((long)p_00 + -5) = '\0';
      *(char *)((long)p_00 + -4) = '\0';
      *(char *)((long)p_00 + -3) = '\0';
      *(char *)((long)p_00 + -2) = '\0';
      *(char *)((long)p_00 + -1) = '\0';
      pcVar7 = span<char>::data((span<char> *)&TORRENT_ALLOCA_size);
      if (pcVar7 != (char *)0x0) {
        *(char *)((long)p_00 + -8) = -0x65;
        *(char *)((long)p_00 + -7) = '\x16';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        local_d0 = (byte *)span<char>::begin((span<char> *)&TORRENT_ALLOCA_size);
        *(char *)((long)p_00 + -8) = -0x4c;
        *(char *)((long)p_00 + -7) = '\x16';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        write_int32<int,char*>(iVar5 + 1,(char **)&local_d0);
        *(char *)((long)p_00 + -8) = -0x39;
        *(char *)((long)p_00 + -7) = '\x16';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        write_uint8<libtorrent::aux::bt_peer_connection::message_type,char*>
                  (msg_bitfield,(char **)&local_d0);
        *(char *)((long)p_00 + -8) = -0x2e;
        *(char *)((long)p_00 + -7) = '\x16';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        *(char *)((long)p_00 + -8) = -0x26;
        *(char *)((long)p_00 + -7) = '\x16';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        local_1d1 = torrent::is_seed(peVar6);
        pbVar2 = local_d0;
        if ((bool)local_1d1) {
          p._7_1_ = 0xff;
          builtin_strncpy((char *)((long)p_00 + -8),"\x0e\x17#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          ::std::fill_n<char*,int,unsigned_char>((char *)pbVar2,iVar5,(uchar *)((long)&p + 7));
          local_1d2 = (char)(0xff << (8 - ((byte)val & 7) & 7));
          builtin_strncpy((char *)((long)p_00 + -8),";\x17#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          pcVar7 = span<char>::back((span<char> *)&TORRENT_ALLOCA_size);
          *pcVar7 = local_1d2;
        }
        else {
          local_1e8 = local_d0;
          builtin_strncpy((char *)((long)p_00 + -8),"r\x17#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          __n = numeric_cast<unsigned_long,int,void>(iVar5);
          pbVar2 = local_1e8;
          local_1e0 = __n;
          *(char *)((long)p_00 + -8) = -0x70;
          *(char *)((long)p_00 + -7) = '\x17';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          memset(pbVar2,0,__n);
          *(char *)((long)p_00 + -8) = -0x67;
          *(char *)((long)p_00 + -7) = '\x17';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          peVar6 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_20);
          *(char *)((long)p_00 + -8) = -0x5f;
          *(char *)((long)p_00 + -7) = '\x17';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          local_1f0 = torrent::picker(peVar6);
          local_e4 = 0x80;
          _i = local_1f0;
          *(char *)((long)p_00 + -8) = -0x2b;
          *(char *)((long)p_00 + -7) = '\x17';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          memset(&local_e8,0,4);
          while( true ) {
            *(char *)((long)p_00 + -8) = -0x1c;
            *(char *)((long)p_00 + -7) = '\x17';
            *(char *)((long)p_00 + -6) = '#';
            *(char *)((long)p_00 + -5) = '\0';
            *(char *)((long)p_00 + -4) = '\0';
            *(char *)((long)p_00 + -3) = '\0';
            *(char *)((long)p_00 + -2) = '\0';
            *(char *)((long)p_00 + -1) = '\0';
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                       ((long)&__range2 + 4),val);
            *(char *)((long)p_00 + -8) = -7;
            *(char *)((long)p_00 + -7) = '\x17';
            *(char *)((long)p_00 + -6) = '#';
            *(char *)((long)p_00 + -5) = '\0';
            *(char *)((long)p_00 + -4) = '\0';
            *(char *)((long)p_00 + -3) = '\0';
            *(char *)((long)p_00 + -2) = '\0';
            *(char *)((long)p_00 + -1) = '\0';
            local_1f1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                                  (&local_e8,
                                   (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                   ((long)&__range2 + 4));
            this_01 = _i;
            index.m_val = local_e8.m_val;
            if (!(bool)local_1f1) break;
            __range2._0_4_ = local_e8.m_val;
            builtin_strncpy((char *)((long)p_00 + -8),".\x18#",4);
            *(char *)((long)p_00 + -4) = '\0';
            *(char *)((long)p_00 + -3) = '\0';
            *(char *)((long)p_00 + -2) = '\0';
            *(char *)((long)p_00 + -1) = '\0';
            local_1f2 = piece_picker::have_piece(this_01,index);
            if ((bool)local_1f2) {
              *local_d0 = *local_d0 | (byte)local_e4;
            }
            local_e4 = local_e4 >> 1;
            if (local_e4 == 0) {
              local_e4 = 0x80;
              local_d0 = local_d0 + 1;
            }
            *(char *)((long)p_00 + -8) = -0x69;
            *(char *)((long)p_00 + -7) = '\x18';
            *(char *)((long)p_00 + -6) = '#';
            *(char *)((long)p_00 + -5) = '\0';
            *(char *)((long)p_00 + -4) = '\0';
            *(char *)((long)p_00 + -3) = '\0';
            *(char *)((long)p_00 + -2) = '\0';
            *(char *)((long)p_00 + -1) = '\0';
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_e8);
          }
        }
        *(char *)((long)p_00 + -8) = -0x57;
        *(char *)((long)p_00 + -7) = '\x18';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        *(char *)((long)p_00 + -8) = -0x4f;
        *(char *)((long)p_00 + -7) = '\x18';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        this_02 = torrent::predictive_pieces(peVar6);
        local_200 = this_02;
        *(char *)((long)p_00 + -8) = -0x2c;
        *(char *)((long)p_00 + -7) = '\x18';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        __end2 = ::std::
                 vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ::begin(this_02);
        *(char *)((long)p_00 + -8) = -0x19;
        *(char *)((long)p_00 + -7) = '\x18';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        cStack_108 = ::std::
                     vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     ::end(this_02);
        while( true ) {
          builtin_strncpy((char *)((long)p_00 + -8),"\x01\x19#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          bVar4 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffef8);
          pbVar3 = local_158;
          if (!bVar4) break;
          builtin_strncpy((char *)((long)p_00 + -8),"\x16\x19#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          psVar8 = __gnu_cxx::
                   __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                   ::operator*(&__end2);
          bitfield_string.field_2._12_4_ = psVar8->m_val;
          builtin_strncpy((char *)((long)p_00 + -8),"*\x19#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          local_204 = strong_typedef::operator_cast_to_int
                                ((strong_typedef *)(bitfield_string.field_2._M_local_buf + 0xc));
          local_20c = 0x80 >> ((byte)local_204 & 7);
          builtin_strncpy((char *)((long)p_00 + -8),"V\x19#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          local_208 = strong_typedef::operator_cast_to_int
                                ((strong_typedef *)(bitfield_string.field_2._M_local_buf + 0xc));
          iVar5 = local_208;
          if (local_208 < 0) {
            iVar5 = local_208 + 7;
          }
          *(char *)((long)p_00 + -8) = -0x80;
          *(char *)((long)p_00 + -7) = '\x19';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          local_218 = (byte *)span<char>::operator[]
                                        ((span<char> *)&TORRENT_ALLOCA_size,(long)((iVar5 >> 3) + 5)
                                        );
          *local_218 = *local_218 | (byte)local_20c;
          *(char *)((long)p_00 + -8) = -0x57;
          *(char *)((long)p_00 + -7) = '\x19';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          __gnu_cxx::
          __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
          ::operator++(&__end2);
        }
        *(char *)((long)p_00 + -8) = -0x41;
        *(char *)((long)p_00 + -7) = '\x19';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        local_219 = peer_connection::should_log(&pbVar3->super_peer_connection,outgoing_message);
        if ((bool)local_219) {
          *(char *)((long)p_00 + -8) = -0x1e;
          *(char *)((long)p_00 + -7) = '\x19';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          ::std::__cxx11::string::string((string *)&n_pieces);
          *(char *)((long)p_00 + -8) = -0x16;
          *(char *)((long)p_00 + -7) = '\x19';
          *(char *)((long)p_00 + -6) = '#';
          *(char *)((long)p_00 + -5) = '\0';
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          k = numeric_cast<unsigned_long,int,void>(val);
          local_228 = k;
          builtin_strncpy((char *)((long)p_00 + -8),"\x14\x1a#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          ::std::__cxx11::string::resize((ulong)&n_pieces);
          for (local_140 = 0; local_140 < k; local_140 = local_140 + 1) {
            iVar5 = (int)local_140;
            if ((int)local_140 < 0) {
              iVar5 = (int)local_140 + 7;
            }
            builtin_strncpy((char *)((long)p_00 + -8),"W\x1a#",4);
            *(char *)((long)p_00 + -4) = '\0';
            *(char *)((long)p_00 + -3) = '\0';
            *(char *)((long)p_00 + -2) = '\0';
            *(char *)((long)p_00 + -1) = '\0';
            local_230 = span<char>::operator[]
                                  ((span<char> *)&TORRENT_ALLOCA_size,(long)((iVar5 >> 3) + 5));
            if (((int)*local_230 & 0x80 >> ((byte)local_140 & 7)) == 0) {
              *(char *)((long)p_00 + -8) = -0x23;
              *(char *)((long)p_00 + -7) = '\x1a';
              *(char *)((long)p_00 + -6) = '#';
              *(char *)((long)p_00 + -5) = '\0';
              *(char *)((long)p_00 + -4) = '\0';
              *(char *)((long)p_00 + -3) = '\0';
              *(char *)((long)p_00 + -2) = '\0';
              *(char *)((long)p_00 + -1) = '\0';
              local_240 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)&n_pieces);
              *local_240 = 0x30;
            }
            else {
              *(char *)((long)p_00 + -8) = -0x68;
              *(char *)((long)p_00 + -7) = '\x1a';
              *(char *)((long)p_00 + -6) = '#';
              *(char *)((long)p_00 + -5) = '\0';
              *(char *)((long)p_00 + -4) = '\0';
              *(char *)((long)p_00 + -3) = '\0';
              *(char *)((long)p_00 + -2) = '\0';
              *(char *)((long)p_00 + -1) = '\0';
              local_238 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)&n_pieces);
              *local_238 = 0x31;
            }
          }
          builtin_strncpy((char *)((long)p_00 + -8),"\x15\x1b#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          uVar9 = ::std::__cxx11::string::c_str();
          pbVar3 = local_158;
          builtin_strncpy((char *)((long)p_00 + -8),"9\x1b#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          peer_connection::peer_log
                    (&pbVar3->super_peer_connection,outgoing_message,"BITFIELD","%s",uVar9);
          builtin_strncpy((char *)((long)p_00 + -8),"E\x1b#",4);
          *(char *)((long)p_00 + -4) = '\0';
          *(char *)((long)p_00 + -3) = '\0';
          *(char *)((long)p_00 + -2) = '\0';
          *(char *)((long)p_00 + -1) = '\0';
          ::std::__cxx11::string::~string((string *)&n_pieces);
        }
        (local_158->super_peer_connection).field_0x889 =
             (local_158->super_peer_connection).field_0x889 | 8;
        builtin_strncpy((char *)((long)p_00 + -8),"k\x1b#",4);
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        span<char_const>::span<libtorrent::span<char>,char,void>
                  ((span<char_const> *)&local_150,(span<char> *)&TORRENT_ALLOCA_size);
        pbVar3 = local_158;
        *(char *)((long)p_00 + -8) = -0x79;
        *(char *)((long)p_00 + -7) = '\x1b';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        peer_connection::send_buffer(&pbVar3->super_peer_connection,local_150);
        pbVar3 = local_158;
        *(char *)((long)p_00 + -8) = -0x6b;
        *(char *)((long)p_00 + -7) = '\x1b';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        this_03 = peer_connection::stats_counters(&pbVar3->super_peer_connection);
        local_248 = this_03;
        *(char *)((long)p_00 + -8) = -0x4c;
        *(char *)((long)p_00 + -7) = '\x1b';
        *(char *)((long)p_00 + -6) = '#';
        *(char *)((long)p_00 + -5) = '\0';
        *(char *)((long)p_00 + -4) = '\0';
        *(char *)((long)p_00 + -3) = '\0';
        *(char *)((long)p_00 + -2) = '\0';
        *(char *)((long)p_00 + -1) = '\0';
        counters::inc_stats_counter(this_03,0x5a,1);
      }
      *(char *)((long)p_00 + -8) = -0x39;
      *(char *)((long)p_00 + -7) = '\x1b';
      *(char *)((long)p_00 + -6) = '#';
      *(char *)((long)p_00 + -5) = '\0';
      *(char *)((long)p_00 + -4) = '\0';
      *(char *)((long)p_00 + -3) = '\0';
      *(char *)((long)p_00 + -2) = '\0';
      *(char *)((long)p_00 + -1) = '\0';
      alloca_destructor<char>::~alloca_destructor((alloca_destructor<char> *)&ptr);
      ppcVar10 = p_00;
    }
  }
LAB_00231bc7:
  *(undefined8 *)((long)ppcVar10 + -8) = 0x231bd0;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_20);
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		aux::write_int32(packet_size - 4, ptr);
		aux::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			auto const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}